

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O2

void ztast_destroy_statements(ztast_t *ast,ztast_statement_t *statements)

{
  ztast_expr *pzVar1;
  ztast_value zVar2;
  int *piVar3;
  ztast_freefn_t *pzVar4;
  int i;
  long lVar5;
  ztast_statement_t *pzVar6;
  
  if (statements == (ztast_statement_t *)0x0) {
    return;
  }
LAB_00102426:
  do {
    pzVar6 = statements;
    if (pzVar6 == (ztast_statement_t *)0x0) {
      return;
    }
    if (pzVar6->type == ZTSTMT_ASSIGNMENT) {
      pzVar1 = ((pzVar6->u).assignment)->expr;
      switch(pzVar1->type) {
      case ZTEXPR_VALUE:
        goto switchD_0010246d_caseD_0;
      case ZTEXPR_SCOPE:
        goto switchD_0010246d_caseD_1;
      case ZTEXPR_INTARRAY:
        zVar2 = *(pzVar1->data).value;
        pzVar4 = ast->freefn;
        if (zVar2 != (ztast_value)0x0) {
          if (pzVar4 != (ztast_freefn_t *)0x0) {
            (*pzVar4)(*(void **)((long)zVar2 + 8),ast->opaque);
            if (ast->freefn != (ztast_freefn_t *)0x0) {
              (*ast->freefn)((void *)zVar2,ast->opaque);
              pzVar4 = ast->freefn;
              goto LAB_001024c1;
            }
          }
          goto LAB_0010258f;
        }
LAB_001024c1:
        if (pzVar4 == (ztast_freefn_t *)0x0) goto switchD_0010246d_default;
        goto LAB_00102542;
      case ZTEXPR_SCOPEARRAY:
        piVar3 = *(int **)pzVar1->data;
        if (piVar3 == (int *)0x0) goto switchD_0010246d_caseD_0;
        for (lVar5 = 0; lVar5 < *piVar3; lVar5 = lVar5 + 1) {
          ztast_destroy_statements
                    (ast,(ztast_statement_t *)**(undefined8 **)(*(long *)(piVar3 + 2) + lVar5 * 8));
          if (ast->freefn != (ztast_freefn_t *)0x0) {
            (*ast->freefn)(*(void **)(*(long *)(piVar3 + 2) + lVar5 * 8),ast->opaque);
          }
        }
        if (ast->freefn != (ztast_freefn_t *)0x0) {
          (*ast->freefn)(*(void **)(piVar3 + 2),ast->opaque);
          if (ast->freefn != (ztast_freefn_t *)0x0) {
            (*ast->freefn)(piVar3,ast->opaque);
            goto switchD_0010246d_caseD_0;
          }
        }
        goto LAB_0010258f;
      default:
        goto switchD_0010246d_default;
      }
    }
LAB_00102439:
    statements = pzVar6->next;
    if (ast->freefn != (ztast_freefn_t *)0x0) {
      (*ast->freefn)(pzVar6,ast->opaque);
    }
  } while( true );
switchD_0010246d_caseD_1:
  ztast_destroy_statements(ast,(ztast_statement_t *)*(pzVar1->data).value);
switchD_0010246d_caseD_0:
  pzVar4 = ast->freefn;
  if (pzVar4 != (ztast_freefn_t *)0x0) {
LAB_00102542:
    (*pzVar4)((pzVar1->data).value,ast->opaque);
switchD_0010246d_default:
    if (ast->freefn != (ztast_freefn_t *)0x0) {
      (*ast->freefn)(pzVar1,ast->opaque);
      if (ast->freefn != (ztast_freefn_t *)0x0) {
        (*ast->freefn)(((pzVar6->u).assignment)->id,ast->opaque);
        if (ast->freefn != (ztast_freefn_t *)0x0) {
          (*ast->freefn)((pzVar6->u).assignment,ast->opaque);
          goto LAB_00102439;
        }
      }
    }
  }
LAB_0010258f:
  statements = pzVar6->next;
  goto LAB_00102426;
}

Assistant:

static void ztast_destroy_statements(ztast_t           *ast,
                                     ztast_statement_t *statements)
{
  ztast_statement_t *st;
  ztast_statement_t *next;

  if (statements == NULL)
    return; /* no statements */

  for (st = statements; st != NULL; st = next)
  {
    switch (st->type)
    {
    case ZTSTMT_ASSIGNMENT:
      ztast_destroy_expr(ast, st->u.assignment->expr);
      ZTAST_FREE(st->u.assignment->id);
      ZTAST_FREE(st->u.assignment);
      break;

    default:
      assert(0);
      break;
    }
    next = st->next;
    ZTAST_FREE(st);
  }
}